

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O1

char * NewtBaseName(char *s,uint32_t len)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (len == 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      pcVar1 = s + uVar3;
      uVar3 = uVar3 + 1;
      if (*pcVar1 == '/') {
        uVar2 = uVar3 & 0xffffffff;
      }
    } while (len != uVar3);
  }
  pcVar1 = (char *)0x0;
  if ((uint)uVar2 < len) {
    pcVar1 = s + uVar2;
  }
  return pcVar1;
}

Assistant:

char * NewtBaseName(char * s, uint32_t len)
{
    uint32_t	base = 0;
    uint32_t	i;
    char		sep;
    
    sep = NewtGetFileSeparator();
    
    for (i = 0; i < len; i++)
    {
        if (s[i] == sep)
            base = i + 1;
    }
    
    if (base < len)
        return (s + base);
    else
        return NULL;
}